

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int MRIStepWriteCoupling(void *arkode_mem,FILE *fp)

{
  FILE *in_RSI;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  FILE *in_stack_ffffffffffffffd8;
  ARKodeMem in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = mriStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(ARKodeMRIStepMem *)0x167429);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd8->_IO_buf_base == (char *)0x0) {
      arkProcessError(in_stack_ffffffffffffffe0,-0x15,0x491,"MRIStepWriteCoupling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep_io.c"
                      ,"Coupling structure is NULL");
      local_4 = -0x15;
    }
    else {
      fprintf(in_RSI,"\nMRIStep coupling structure:\n");
      MRIStepCoupling_Write((MRIStepCoupling)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int MRIStepWriteCoupling(void* arkode_mem, FILE* fp)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* check that coupling structure is non-NULL (otherwise report error) */
  if (step_mem->MRIC == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "Coupling structure is NULL");
    return (ARK_MEM_NULL);
  }

  /* write coupling structure to specified file */
  fprintf(fp, "\nMRIStep coupling structure:\n");
  MRIStepCoupling_Write(step_mem->MRIC, fp);

  return (ARK_SUCCESS);
}